

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

StatT * __thiscall MyGame::Example::Stat::UnPack(Stat *this,resolver_function_t *_resolver)

{
  StatT *this_00;
  pointer pSVar1;
  unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_> local_20;
  unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_> _o;
  resolver_function_t *_resolver_local;
  Stat *this_local;
  
  _o._M_t.
  super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>._M_t.
  super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>.
  super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl =
       (__uniq_ptr_data<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>,_true,_true>
        )(__uniq_ptr_data<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>,_true,_true>
          )_resolver;
  this_00 = (StatT *)operator_new(0x30);
  this_00->val = 0;
  *(undefined8 *)&this_00->count = 0;
  (this_00->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->id).field_2 + 8) = 0;
  *(undefined8 *)&this_00->id = 0;
  (this_00->id)._M_string_length = 0;
  StatT::StatT(this_00);
  std::unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>>::
  unique_ptr<std::default_delete<MyGame::Example::StatT>,void>
            ((unique_ptr<MyGame::Example::StatT,std::default_delete<MyGame::Example::StatT>> *)
             &local_20,this_00);
  pSVar1 = std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::
           get(&local_20);
  UnPackTo(this,pSVar1,
           (resolver_function_t *)
           _o._M_t.
           super___uniq_ptr_impl<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>
           ._M_t.
           super__Tuple_impl<0UL,_MyGame::Example::StatT_*,_std::default_delete<MyGame::Example::StatT>_>
           .super__Head_base<0UL,_MyGame::Example::StatT_*,_false>._M_head_impl);
  pSVar1 = std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::
           release(&local_20);
  std::unique_ptr<MyGame::Example::StatT,_std::default_delete<MyGame::Example::StatT>_>::~unique_ptr
            (&local_20);
  return pSVar1;
}

Assistant:

inline StatT *Stat::UnPack(const ::flatbuffers::resolver_function_t *_resolver) const {
  auto _o = std::unique_ptr<StatT>(new StatT());
  UnPackTo(_o.get(), _resolver);
  return _o.release();
}